

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O1

void stream_encoder_end(lzma_coder_conflict2 *coder,lzma_allocator *allocator)

{
  lzma_filter *plVar1;
  
  lzma_next_end((lzma_next_coder *)&coder->block_encoder,allocator);
  lzma_next_end((lzma_next_coder *)&coder->index_encoder,allocator);
  lzma_index_end(coder->index,allocator);
  if (coder->filters[0].id != 0xffffffffffffffff) {
    plVar1 = coder->filters;
    do {
      plVar1 = plVar1 + 1;
      lzma_free(plVar1[-1].options,allocator);
    } while (plVar1->id != 0xffffffffffffffff);
  }
  lzma_free(coder,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(lzma_coder *coder, lzma_allocator *allocator)
{
	size_t i;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}